

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void pop_heap_suite::pop_decreasing_predicate(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_70 [8];
  array<int,_4UL> expect_3;
  array<int,_4UL> expect_2;
  array<int,_4UL> expect_1;
  array<int,_4UL> expect;
  iterator last;
  array<int,_4UL> heap;
  
  last = (iterator)0x160000000b;
  heap._M_elems[0] = 0x21;
  heap._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_heap<int*,std::greater<int>>(pvVar2,pvVar1);
  pvVar1[-1] = 0;
  stack0xffffffffffffffcc = 0x2c00000016;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_1._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_1._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x297,"void pop_heap_suite::pop_decreasing_predicate()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_heap<int*,std::greater<int>>(pvVar2,pvVar1 + -1);
  pvVar1[-2] = 0;
  stack0xffffffffffffffb8 = 0x2c00000021;
  expect_1._M_elems[0] = 0;
  expect_1._M_elems[1] = 0;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_2._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_2._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x29e,"void pop_heap_suite::pop_decreasing_predicate()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_heap<int*,std::greater<int>>(pvVar2,pvVar1 + -2);
  pvVar1[-3] = 0;
  stack0xffffffffffffffa4 = 0x2c;
  expect_2._M_elems[0] = 0;
  expect_2._M_elems[1] = 0;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_3._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_3._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2a5,"void pop_heap_suite::pop_decreasing_predicate()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_heap<int*,std::greater<int>>(pvVar2);
  pvVar1[-4] = 0;
  memset(local_70,0,0x10);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_70);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)local_70);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2ac,"void pop_heap_suite::pop_decreasing_predicate()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void pop_decreasing_predicate()
{
    std::array<int, 4> heap = { 11, 22, 33, 44 }; // Result of push_suite::push_decreasing_predicate
    auto last = heap.end();
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 22, 44, 33, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 33, 44, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 44, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}